

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

string * __thiscall
duckdb::Prefix::VerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Prefix *this,ART *art,Node *node,bool only_verify)

{
  Node ptr_p;
  ulong uVar1;
  string child;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Prefix local_68;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)&local_88,anon_var_dwarf_3b6586a + 9,(allocator *)&local_a8);
  do {
    ptr_p.super_IndexPointer.data = (IndexPointer)(art->super_BoundIndex).super_Index._vptr_Index;
    if (((ulong)ptr_p.super_IndexPointer.data & 0x7f00000000000000) != 0x100000000000000) break;
    Prefix(&local_68,(ART *)this,ptr_p,false,false);
    ::std::__cxx11::string::append((char *)&local_88);
    for (uVar1 = 0; uVar1 < local_68.data[*(byte *)((long)&this[0x11].data + 2)]; uVar1 = uVar1 + 1)
    {
      ::std::__cxx11::to_string(&local_50,(uint)local_68.data[uVar1]);
      ::std::operator+(&local_a8,&local_50,"-");
      ::std::__cxx11::string::append((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::append((char *)&local_88);
    art = (ART *)local_68.ptr;
  } while (-1 < (long)(((BoundIndex *)&(local_68.ptr)->super_IndexPointer)->super_Index)._vptr_Index
          );
  Node::VerifyAndToString_abi_cxx11_(&local_a8,(Node *)art,(ART *)this,SUB81(node,0));
  if (SUB81(node,0) == false) {
    ::std::operator+(__return_storage_ptr__,&local_88,&local_a8);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_3b6586a + 9,(allocator *)&local_50);
  }
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string Prefix::VerifyAndToString(ART &art, const Node &node, const bool only_verify) {
	string str = "";
	reference<const Node> ref(node);

	Iterator(art, ref, true, false, [&](Prefix &prefix) {
		D_ASSERT(prefix.data[Count(art)] != 0);
		D_ASSERT(prefix.data[Count(art)] <= Count(art));

		str += " Prefix :[ ";
		for (idx_t i = 0; i < prefix.data[Count(art)]; i++) {
			str += to_string(prefix.data[i]) + "-";
		}
		str += " ] ";
	});

	auto child = ref.get().VerifyAndToString(art, only_verify);
	return only_verify ? "" : str + child;
}